

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,REF_INT id)

{
  REF_GRID pRVar1;
  REF_AGENTS ref_agents_00;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rsb;
  REF_AGENTS ref_agents;
  REF_DBL bary [4];
  int local_ac;
  REF_INT limit;
  REF_INT i;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GRID ref_grid;
  REF_INT id_local;
  REF_INTERP ref_interp_local;
  
  pRVar1 = ref_interp->from_grid;
  unique0x00012000 = pRVar1->node;
  ref_agents_00 = ref_interp->ref_agents;
  if (pRVar1->twod == 0) {
    ref_node = (REF_NODE)ref_interp->from_tet;
  }
  else {
    ref_node = (REF_NODE)ref_interp->from_tri;
  }
  do {
    if (0xd6 < ref_agents_00->agent[id].step) {
      ref_agents_00->agent[id].mode = REF_AGENT_TERMINATED;
      return 0;
    }
    if (ref_agents_00->agent[id].mode != REF_AGENT_WALKING) {
      return 0;
    }
    uVar2 = ref_cell_nodes((REF_CELL)ref_node,ref_agents_00->agent[id].seed,&limit);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x2a2,"ref_interp_walk_agent",(ulong)uVar2,"cell");
      ref_agents_tattle(ref_agents_00,id,"cell_nodes in walk");
      return uVar2;
    }
    if (pRVar1->twod == 0) {
      uVar2 = ref_node_bary4(stack0xffffffffffffffc8,&limit,ref_agents_00->agent[id].xyz,
                             (REF_DBL *)&ref_agents);
      if ((uVar2 != 0) && (uVar2 != 4)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x2ac,"ref_interp_walk_agent",(ulong)uVar2,"bary");
        return uVar2;
      }
    }
    else {
      bary[2] = 0.0;
      uVar2 = ref_node_bary3(stack0xffffffffffffffc8,&limit,ref_agents_00->agent[id].xyz,
                             (REF_DBL *)&ref_agents);
      if ((uVar2 != 0) && (uVar2 != 4)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x2a8,"ref_interp_walk_agent",(ulong)uVar2,"bary");
        return uVar2;
      }
    }
    if (0xd7 < ref_agents_00->agent[id].step) {
      printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n",ref_agents,bary[0],bary[1],bary[2],
             ref_interp->inside,(ulong)(uint)ref_agents_00->agent[id].step);
      uVar2 = ref_agents_tattle(ref_agents_00,id,"many steps");
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x2b3,"ref_interp_walk_agent",(ulong)uVar2,"tat");
        return uVar2;
      }
    }
    if ((((ref_interp->inside <= (double)ref_agents) && (ref_interp->inside <= bary[0])) &&
        (ref_interp->inside <= bary[1])) && (ref_interp->inside <= bary[2])) {
      ref_agents_00->agent[id].mode = REF_AGENT_ENCLOSING;
      for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
        ref_agents_00->agent[id].bary[local_ac] = bary[(long)local_ac + -1];
      }
      return 0;
    }
    if (pRVar1->twod == 0) {
      if (((bary[0] <= (double)ref_agents) || (bary[1] <= (double)ref_agents)) ||
         (bary[2] <= (double)ref_agents)) {
        if ((((double)ref_agents <= bary[0]) || (bary[2] <= bary[0])) || (bary[1] <= bary[0])) {
          if ((((double)ref_agents <= bary[1]) || (bary[0] <= bary[1])) || (bary[2] <= bary[1])) {
            if ((((double)ref_agents <= bary[2]) || (bary[1] <= bary[2])) || (bary[0] <= bary[2])) {
              if (((bary[0] < (double)ref_agents) || (bary[1] < (double)ref_agents)) ||
                 (bary[2] < (double)ref_agents)) {
                if ((((double)ref_agents < bary[0]) || (bary[2] < bary[0])) || (bary[1] < bary[0]))
                {
                  if ((((double)ref_agents < bary[1]) || (bary[0] < bary[1])) || (bary[2] < bary[1])
                     ) {
                    if ((((double)ref_agents < bary[2]) || (bary[1] < bary[2])) ||
                       (bary[0] < bary[2])) goto LAB_001aab19;
                    uVar2 = ref_update_agent_tet_seed(ref_interp,id,limit,nodes[0],i);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x314,"ref_interp_walk_agent",(ulong)uVar2,"0 2 1");
                      return uVar2;
                    }
                  }
                  else {
                    uVar2 = ref_update_agent_tet_seed(ref_interp,id,limit,i,nodes[1]);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x30d,"ref_interp_walk_agent",(ulong)uVar2,"0 1 3");
                      return uVar2;
                    }
                  }
                }
                else {
                  uVar2 = ref_update_agent_tet_seed(ref_interp,id,limit,nodes[1],nodes[0]);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x306,"ref_interp_walk_agent",(ulong)uVar2,"0 3 2");
                    return uVar2;
                  }
                }
              }
              else {
                uVar2 = ref_update_agent_tet_seed(ref_interp,id,i,nodes[0],nodes[1]);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x2ff,"ref_interp_walk_agent",(ulong)uVar2,"1 2 3");
                  return uVar2;
                }
              }
            }
            else {
              uVar2 = ref_update_agent_tet_seed(ref_interp,id,limit,nodes[0],i);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x2f7,"ref_interp_walk_agent",(ulong)uVar2,"0 2 1");
                return uVar2;
              }
            }
          }
          else {
            uVar2 = ref_update_agent_tet_seed(ref_interp,id,limit,i,nodes[1]);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x2f0,"ref_interp_walk_agent",(ulong)uVar2,"0 1 3");
              return uVar2;
            }
          }
        }
        else {
          uVar2 = ref_update_agent_tet_seed(ref_interp,id,limit,nodes[1],nodes[0]);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x2e9,"ref_interp_walk_agent",(ulong)uVar2,"0 3 2");
            return uVar2;
          }
        }
      }
      else {
        uVar2 = ref_update_agent_tet_seed(ref_interp,id,i,nodes[0],nodes[1]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x2e2,"ref_interp_walk_agent",(ulong)uVar2,"1 2 3");
          return uVar2;
        }
      }
    }
    else if ((bary[0] <= (double)ref_agents) || (bary[1] <= (double)ref_agents)) {
      if (((double)ref_agents <= bary[0]) || (bary[1] <= bary[0])) {
        if (((double)ref_agents <= bary[1]) || ((double)ref_agents <= bary[1])) {
          if ((bary[0] < (double)ref_agents) || (bary[1] < (double)ref_agents)) {
            if (((double)ref_agents < bary[0]) || (bary[1] < bary[0])) {
              if (((double)ref_agents < bary[1]) || ((double)ref_agents < bary[1])) {
LAB_001aab19:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x318,"ref_interp_walk_agent","unable to find the next step");
                return 1;
              }
              uVar2 = ref_update_agent_tri_seed(ref_interp,id,limit,i);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x2da,"ref_interp_walk_agent",(ulong)uVar2,"0 1");
                return uVar2;
              }
            }
            else {
              uVar2 = ref_update_agent_tri_seed(ref_interp,id,nodes[0],limit);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x2d5,"ref_interp_walk_agent",(ulong)uVar2,"2 0");
                return uVar2;
              }
            }
          }
          else {
            uVar2 = ref_update_agent_tri_seed(ref_interp,id,i,nodes[0]);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x2d0,"ref_interp_walk_agent",(ulong)uVar2,"1 2");
              return uVar2;
            }
          }
        }
        else {
          uVar2 = ref_update_agent_tri_seed(ref_interp,id,limit,i);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x2ca,"ref_interp_walk_agent",(ulong)uVar2,"0 1");
            return uVar2;
          }
        }
      }
      else {
        uVar2 = ref_update_agent_tri_seed(ref_interp,id,nodes[0],limit);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x2c5,"ref_interp_walk_agent",(ulong)uVar2,"2 0");
          return uVar2;
        }
      }
    }
    else {
      uVar2 = ref_update_agent_tri_seed(ref_interp,id,i,nodes[0]);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x2c0,"ref_interp_walk_agent",(ulong)uVar2,"1 2");
        return uVar2;
      }
    }
    ref_agents_00->agent[id].step = ref_agents_00->agent[id].step + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,
                                                REF_INT id) {
  REF_GRID ref_grid = ref_interp_from_grid(ref_interp);
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, limit;
  REF_DBL bary[4];
  REF_AGENTS ref_agents = ref_interp->ref_agents;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_interp_from_tri(ref_interp);
  } else {
    ref_cell = ref_interp_from_tet(ref_interp);
  }

  limit = 215; /* 10e6^(1/3), required 108 for twod testcase  */

  each_ref_agent_step(ref_agents, id, limit) {
    /* return if no longer walking */
    if (REF_AGENT_WALKING != ref_agent_mode(ref_agents, id)) {
      return REF_SUCCESS;
    }

    RSB(ref_cell_nodes(ref_cell, ref_agent_seed(ref_agents, id), nodes), "cell",
        { ref_agents_tattle(ref_agents, id, "cell_nodes in walk"); });
    /* when REF_DIV_ZERO, min bary is preserved */
    if (ref_grid_twod(ref_grid)) {
      bary[3] = 0.0;
      RXS(ref_node_bary3(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    } else {
      RXS(ref_node_bary4(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    }

    if (ref_agent_step(ref_agents, id) > (limit)) {
      printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n", bary[0], bary[1],
             bary[2], bary[3], ref_interp->inside,
             ref_agent_step(ref_agents, id));
      RSS(ref_agents_tattle(ref_agents, id, "many steps"), "tat");
    }

    if (ref_interp_bary_inside(ref_interp, bary)) {
      ref_agent_mode(ref_agents, id) = REF_AGENT_ENCLOSING;
      for (i = 0; i < 4; i++) ref_agent_bary(ref_agents, i, id) = bary[i];
      return REF_SUCCESS;
    }

    if (ref_grid_twod(ref_grid)) {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] < bary[0] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] < bary[0] && bary[2] < bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] <= bary[0] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] <= bary[0] && bary[2] <= bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
    } else {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2] && bary[0] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] < bary[0] && bary[1] < bary[3] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] < bary[0] && bary[2] < bary[1] && bary[2] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] < bary[0] && bary[3] < bary[2] && bary[3] < bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }

      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2] && bary[0] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] <= bary[0] && bary[1] <= bary[3] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] <= bary[0] && bary[2] <= bary[1] && bary[2] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] <= bary[0] && bary[3] <= bary[2] && bary[3] <= bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }
    }
    THROW("unable to find the next step");
  }

  /* steps reached limit */
  ref_agent_mode(ref_agents, id) = REF_AGENT_TERMINATED;

  return REF_SUCCESS;
}